

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1869::run(TestCase1869 *this)

{
  float fVar1;
  float local_16c;
  DebugComparison<float,_float> _kjCondition;
  Builder local_148;
  Builder root;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_148,&message.super_MessageBuilder);
  _kjCondition.op.content.size_ = (size_t)local_148.builder.pointer;
  _kjCondition.op.content.ptr = (char *)local_148.builder.capTable;
  PointerBuilder::initStruct(&root._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x1);
  fVar1 = (float)(*root._builder.data ^ 0x42f60000);
  _kjCondition.result = fVar1 == 123.0;
  _kjCondition._0_8_ = CONCAT44(*root._builder.data,0x42f60000) ^ 0x42f6000000000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((fVar1 != 123.0) || (NAN(fVar1))) && (kj::_::Debug::minSeverity < 3)) {
    local_148.builder.segment._0_4_ = 0x42f60000;
    local_16c = (float)(*root._builder.data ^ 0x42f60000);
    kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x751,ERROR,
               "\"failed: expected \" \"(123.0f) == (root.getField())\", _kjCondition, 123.0f, root.getField()"
               ,(char (*) [47])"failed: expected (123.0f) == (root.getField())",&_kjCondition,
               (float *)&local_148,&local_16c);
  }
  fVar1 = (float)(*(uint *)((long)root._builder.data + 4) ^ 0x71c9f2ca);
  _kjCondition.result = fVar1 == 2e+30;
  _kjCondition._0_8_ =
       CONCAT44(*(uint *)((long)root._builder.data + 4),0x71c9f2ca) ^ 0x71c9f2ca00000000;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((fVar1 != 2e+30) || (NAN(fVar1))) && (kj::_::Debug::minSeverity < 3)) {
    local_148.builder.segment._0_4_ = 0x71c9f2ca;
    local_16c = (float)(*(uint *)((long)root._builder.data + 4) ^ 0x71c9f2ca);
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x752,ERROR,
               "\"failed: expected \" \"(2e30f) == (root.getBigField())\", _kjCondition, 2e30f, root.getBigField()"
               ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",&_kjCondition,
               (float *)&local_148,&local_16c);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}